

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_gc2gc(HTS_Vocoder *v,double *c1,int m1,double g1,double *c2,int m2,double g2)

{
  void *pvVar1;
  undefined8 *in_RCX;
  int in_EDX;
  double *in_RSI;
  long in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double cc;
  double ss2;
  double ss1;
  int mk;
  int k;
  int min;
  int i;
  int local_64;
  size_t in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  double dVar3;
  double local_50;
  int local_44;
  int local_3c;
  
  if (*(ulong *)(in_RDI + 0xf8) < (ulong)(long)in_EDX) {
    if (*(long *)(in_RDI + 0xf0) != 0) {
      HTS_free((void *)0x114b8b);
    }
    pvVar1 = HTS_calloc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    *(void **)(in_RDI + 0xf0) = pvVar1;
    *(long *)(in_RDI + 0xf8) = (long)in_EDX;
  }
  HTS_movem(in_RSI,*(double **)(in_RDI + 0xf0),in_EDX + 1);
  *in_RCX = **(undefined8 **)(in_RDI + 0xf0);
  for (local_3c = 1; local_3c <= in_R8D; local_3c = local_3c + 1) {
    dVar3 = 0.0;
    local_50 = 0.0;
    local_64 = in_EDX;
    if (local_3c <= in_EDX) {
      local_64 = local_3c + -1;
    }
    for (local_44 = 1; local_44 <= local_64; local_44 = local_44 + 1) {
      dVar2 = *(double *)(*(long *)(in_RDI + 0xf0) + (long)local_44 * 8) *
              (double)in_RCX[local_3c - local_44];
      dVar3 = (double)local_44 * dVar2 + dVar3;
      local_50 = (double)(local_3c - local_44) * dVar2 + local_50;
    }
    if (in_EDX < local_3c) {
      in_RCX[local_3c] = (in_XMM1_Qa * dVar3 + -(in_XMM0_Qa * local_50)) / (double)local_3c;
    }
    else {
      in_RCX[local_3c] =
           *(double *)(*(long *)(in_RDI + 0xf0) + (long)local_3c * 8) +
           (in_XMM1_Qa * dVar3 + -(in_XMM0_Qa * local_50)) / (double)local_3c;
    }
  }
  return;
}

Assistant:

static void HTS_gc2gc(HTS_Vocoder * v, double *c1, const int m1, const double g1, double *c2, const int m2, const double g2)
{
   int i, min, k, mk;
   double ss1, ss2, cc;

   if (m1 > v->gc2gc_size) {
      if (v->gc2gc_buff != NULL)
         HTS_free(v->gc2gc_buff);
      v->gc2gc_buff = (double *) HTS_calloc(m1 + 1, sizeof(double));
      v->gc2gc_size = m1;
   }

   HTS_movem(c1, v->gc2gc_buff, m1 + 1);

   c2[0] = v->gc2gc_buff[0];
   for (i = 1; i <= m2; i++) {
      ss1 = ss2 = 0.0;
      min = m1 < i ? m1 : i - 1;
      for (k = 1; k <= min; k++) {
         mk = i - k;
         cc = v->gc2gc_buff[k] * c2[mk];
         ss2 += k * cc;
         ss1 += mk * cc;
      }

      if (i <= m1)
         c2[i] = v->gc2gc_buff[i] + (g2 * ss2 - g1 * ss1) / i;
      else
         c2[i] = (g2 * ss2 - g1 * ss1) / i;
   }
}